

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O1

int ERKStepSetOrder(void *arkode_mem,int ord)

{
  int iVar1;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeERKStepMem local_38;
  ARKodeMem local_30;
  int local_28;
  int local_24;
  
  iVar1 = erkStep_AccessStepMem(arkode_mem,"ERKStepSetOrder",&local_30,&local_38);
  if (iVar1 == 0) {
    iVar1 = 4;
    if (0 < ord) {
      iVar1 = ord;
    }
    local_38->q = iVar1;
    iVar1 = 0;
    local_38->p = 0;
    local_38->stages = 0;
    ARKodeButcherTable_Space(local_38->B,&local_28,&local_24);
    ARKodeButcherTable_Free(local_38->B);
    local_38->B = (ARKodeButcherTable)0x0;
    local_30->liw = local_30->liw - (long)local_28;
    local_30->lrw = local_30->lrw - (long)local_24;
  }
  return iVar1;
}

Assistant:

int ERKStepSetOrder(void *arkode_mem, int ord)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepSetOrder",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* set user-provided value, or default, depending on argument */
  if (ord <= 0) {
    step_mem->q = Q_DEFAULT;
  } else {
    step_mem->q = ord;
  }

  /* clear Butcher tables, since user is requesting a change in method
     or a reset to defaults.  Tables will be set in ARKInitialSetup. */
  step_mem->stages = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->B);
  step_mem->B = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  return(ARK_SUCCESS);
}